

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

void __thiscall SQASTReader::readTableBody(SQASTReader *this,TableDecl *table)

{
  InputStream *pIVar1;
  int iVar2;
  Expr *key;
  Expr *value;
  byte bVar3;
  uint64_t v_1;
  ulong uVar4;
  ulong uVar5;
  uint64_t v;
  ulong uVar6;
  
  pIVar1 = this->stream;
  uVar6 = 0;
  bVar3 = 0;
  do {
    iVar2 = (**pIVar1->_vptr_InputStream)(pIVar1);
    uVar6 = uVar6 | (ulong)((byte)iVar2 & 0x7f) << (bVar3 & 0x3f);
    bVar3 = bVar3 + 7;
  } while ((char)(byte)iVar2 < '\0');
  ArenaVector<SQCompilation::TableMember>::resize(&table->_members,(size_type_conflict)uVar6);
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      key = readExpression(this);
      value = readExpression(this);
      pIVar1 = this->stream;
      uVar4 = 0;
      bVar3 = 0;
      do {
        iVar2 = (**pIVar1->_vptr_InputStream)(pIVar1);
        uVar4 = uVar4 | (ulong)((byte)iVar2 & 0x7f) << (bVar3 & 0x3f);
        bVar3 = bVar3 + 7;
      } while ((char)(byte)iVar2 < '\0');
      SQCompilation::TableDecl::addMember(table,key,value,(uint)uVar4);
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar6);
  }
  return;
}

Assistant:

void SQASTReader::readTableBody(TableDecl *table) {
  size_t size = stream->readUIntptr();
  table->members().resize(size);

  for (size_t i = 0; i < size; ++i) {
    Expr *key = readExpression();
    Expr *value = readExpression();
    unsigned flags = stream->readUInt32();

    table->addMember(key, value, flags);
  }
}